

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__create_png_image_raw
              (stbi__png *a,stbi_uc *raw,stbi__uint32 raw_len,int out_n,stbi__uint32 x,
              stbi__uint32 y,int depth,int color)

{
  ushort *puVar1;
  int a_00;
  uint uVar2;
  uint uVar3;
  int iVar4;
  stbi_uc *psVar5;
  ulong uVar6;
  byte bVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  stbi_uc *psVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  byte bVar17;
  char *pcVar18;
  uint uVar19;
  byte bVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  ulong uVar26;
  stbi_uc *psVar27;
  uint uVar28;
  byte *pbVar29;
  uint uVar30;
  uint uVar31;
  stbi_uc *psVar32;
  byte *pbVar33;
  int iVar34;
  uint uVar35;
  long in_FS_OFFSET;
  bool bVar36;
  ulong local_68;
  ulong uVar20;
  
  bVar36 = depth == 0x10;
  uVar2 = x * out_n;
  uVar3 = uVar2 << bVar36;
  a_00 = a->s->img_n;
  uVar30 = a_00 << bVar36;
  if (a_00 + 1 != out_n && a_00 != out_n) {
    __assert_fail("out_n == s->img_n || out_n == s->img_n+1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/extern/stb/stb_image.h"
                  ,0x11c8,
                  "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                 );
  }
  psVar5 = (stbi_uc *)stbi__malloc_mad3(x,y,out_n << bVar36,0);
  a->out = psVar5;
  if (psVar5 == (stbi_uc *)0x0) {
    pcVar18 = "Out of memory";
  }
  else {
    iVar4 = stbi__mad3sizes_valid(a_00,x,depth,7);
    pcVar18 = "Corrupt PNG";
    if (iVar4 != 0) {
      uVar8 = a_00 * x;
      uVar19 = uVar8 * depth + 7 >> 3;
      uVar20 = (ulong)uVar19;
      if ((uVar19 + 1) * y <= raw_len) {
        if (y == 0) {
joined_r0x001648d5:
          if (depth != 0x10) {
            return 1;
          }
LAB_001648d7:
          if (uVar2 * y == 0) {
            return 1;
          }
          psVar5 = a->out;
          lVar10 = 0;
          do {
            puVar1 = (ushort *)(psVar5 + lVar10 * 2);
            *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
            lVar10 = lVar10 + 1;
          } while (uVar2 * y != (int)lVar10);
          return 1;
        }
        bVar17 = *raw;
        if (bVar17 < 5) {
          lVar10 = (long)a_00;
          lVar22 = (long)(out_n << bVar36);
          iVar4 = x - 1;
          uVar6 = (ulong)y;
          psVar5 = a->out;
          lVar23 = -lVar22;
          lVar15 = -(ulong)uVar3;
          uVar16 = 0;
          lVar24 = 0;
          local_68 = (ulong)x;
          do {
            if (depth < 8) {
              if (x < uVar19) break;
              psVar5 = psVar5 + (uVar2 - uVar19);
              uVar30 = 1;
              local_68 = uVar20;
            }
            if (lVar24 == 0) {
              bVar17 = ""[bVar17];
            }
            if (0 < (int)uVar30) {
              uVar26 = 0;
              do {
                switch(bVar17) {
                case 0:
                case 1:
                case 5:
                case 6:
                  bVar7 = raw[uVar26 + 1];
                  goto LAB_00164a20;
                case 2:
                case 4:
                  bVar7 = psVar5[uVar26 + lVar15];
                  break;
                case 3:
                  bVar7 = psVar5[uVar26 + lVar15] >> 1;
                  break;
                default:
                  goto switchD_00164a08_default;
                }
                bVar7 = bVar7 + raw[uVar26 + 1];
LAB_00164a20:
                psVar5[uVar26] = bVar7;
switchD_00164a08_default:
                uVar26 = uVar26 + 1;
              } while (uVar30 != uVar26);
            }
            if (depth == 8) {
              lVar25 = (long)out_n;
              lVar11 = lVar10;
              if (a_00 != out_n) {
                psVar5[lVar10] = 0xff;
              }
LAB_00164a80:
              raw = raw + lVar11 + 1;
            }
            else {
              if (depth == 0x10) {
                lVar11 = (long)(int)uVar30;
                lVar25 = lVar22;
                if (a_00 != out_n) {
                  psVar5[lVar11] = 0xff;
                  psVar5[lVar11 + 1] = 0xff;
                }
                goto LAB_00164a80;
              }
              raw = raw + 2;
              lVar25 = 1;
            }
            psVar32 = psVar5 + lVar25;
            if (depth < 8 || a_00 == out_n) {
              uVar9 = ((int)local_68 + -1) * uVar30;
              switch(bVar17) {
              case 0:
                memcpy(psVar32,raw,(long)(int)uVar9);
                break;
              case 1:
                if (0 < (int)uVar9) {
                  uVar16 = 0;
                  do {
                    psVar32[uVar16] = psVar5[uVar16 + (lVar25 - (int)uVar30)] + raw[uVar16];
                    uVar16 = uVar16 + 1;
                  } while (uVar9 != uVar16);
                }
                break;
              case 2:
                if (0 < (int)uVar9) {
                  uVar16 = 0;
                  do {
                    psVar32[uVar16] = psVar32[uVar16 + lVar15] + raw[uVar16];
                    uVar16 = uVar16 + 1;
                  } while (uVar9 != uVar16);
                }
                break;
              case 3:
                if (0 < (int)uVar9) {
                  uVar16 = 0;
                  do {
                    psVar32[uVar16] =
                         (char)((uint)psVar5[uVar16 + (lVar25 - (int)uVar30)] +
                                (uint)psVar32[uVar16 + lVar15] >> 1) + raw[uVar16];
                    uVar16 = uVar16 + 1;
                  } while (uVar9 != uVar16);
                }
                break;
              case 4:
                if (0 < (int)uVar9) {
                  pbVar33 = psVar5 + (lVar25 - (int)uVar30);
                  uVar16 = 0;
                  do {
                    bVar17 = *pbVar33;
                    bVar7 = psVar32[lVar15];
                    bVar21 = pbVar33[lVar15];
                    iVar34 = ((uint)bVar7 + (uint)bVar17) - (uint)bVar21;
                    uVar28 = iVar34 - (uint)bVar17;
                    uVar31 = -uVar28;
                    if (0 < (int)uVar28) {
                      uVar31 = uVar28;
                    }
                    uVar13 = iVar34 - (uint)bVar7;
                    uVar28 = -uVar13;
                    if (0 < (int)uVar13) {
                      uVar28 = uVar13;
                    }
                    uVar35 = iVar34 - (uint)bVar21;
                    uVar13 = -uVar35;
                    if (0 < (int)uVar35) {
                      uVar13 = uVar35;
                    }
                    if (uVar28 <= uVar13) {
                      bVar21 = bVar7;
                    }
                    if (uVar13 < uVar31) {
                      bVar17 = bVar21;
                    }
                    if (uVar28 < uVar31) {
                      bVar17 = bVar21;
                    }
                    *psVar32 = bVar17 + raw[uVar16];
                    uVar16 = uVar16 + 1;
                    pbVar33 = pbVar33 + 1;
                    psVar32 = psVar32 + 1;
                  } while (uVar9 != uVar16);
                }
                break;
              case 5:
                if (0 < (int)uVar9) {
                  uVar16 = 0;
                  do {
                    psVar32[uVar16] = (psVar5[uVar16 + (lVar25 - (int)uVar30)] >> 1) + raw[uVar16];
                    uVar16 = uVar16 + 1;
                  } while (uVar9 != uVar16);
                }
                break;
              case 6:
                if (0 < (int)uVar9) {
                  uVar16 = 0;
                  do {
                    psVar32[uVar16] = psVar5[uVar16 + (lVar25 - (int)uVar30)] + raw[uVar16];
                    uVar16 = uVar16 + 1;
                  } while (uVar9 != uVar16);
                }
              }
              raw = raw + (int)uVar9;
LAB_00164fc8:
              if (lVar24 + 1U == uVar6) {
                if (depth < 8) {
                  if (y == 0) {
                    return 1;
                  }
                  uVar30 = x - 1;
                  lVar15 = uVar2 - uVar20;
                  lVar10 = (ulong)uVar30 + 1;
                  uVar19 = 0;
                  uVar16 = 0;
                  do {
                    bVar17 = 1;
                    if (color == 0) {
                      bVar17 = ""[depth];
                    }
                    psVar5 = a->out;
                    pbVar29 = psVar5 + uVar3 * (int)uVar16;
                    pbVar33 = pbVar29 + (uVar2 - uVar20);
                    uVar26 = (ulong)uVar19;
                    if (depth == 4) {
                      uVar9 = uVar8;
                      if (1 < (int)uVar8) {
                        psVar32 = psVar5 + lVar15;
                        uVar31 = uVar8;
                        do {
                          psVar5[uVar26] = (psVar32[uVar26] >> 4) * bVar17;
                          psVar5[uVar26 + 1] = (psVar32[uVar26] & 0xf) * bVar17;
                          uVar9 = uVar31 - 2;
                          psVar32 = psVar32 + 1;
                          psVar5 = psVar5 + 2;
                          bVar36 = 3 < uVar31;
                          uVar31 = uVar9;
                        } while (bVar36);
                        pbVar33 = psVar32 + uVar26;
                        pbVar29 = psVar5 + uVar26;
                      }
                      if (uVar9 == 1) {
                        *pbVar29 = (*pbVar33 >> 4) * bVar17;
                      }
                    }
                    else if (depth == 2) {
                      uVar9 = uVar8;
                      if (3 < (int)uVar8) {
                        psVar32 = psVar5 + lVar15;
                        uVar31 = uVar8;
                        do {
                          psVar5[uVar26] = (psVar32[uVar26] >> 6) * bVar17;
                          psVar5[uVar26 + 1] = (psVar32[uVar26] >> 4 & 3) * bVar17;
                          psVar5[uVar26 + 2] = (psVar32[uVar26] >> 2 & 3) * bVar17;
                          psVar5[uVar26 + 3] = (psVar32[uVar26] & 3) * bVar17;
                          uVar9 = uVar31 - 4;
                          psVar32 = psVar32 + 1;
                          psVar5 = psVar5 + 4;
                          bVar36 = 7 < uVar31;
                          uVar31 = uVar9;
                        } while (bVar36);
                        pbVar33 = psVar32 + uVar26;
                        pbVar29 = psVar5 + uVar26;
                      }
                      if (((0 < (int)uVar9) && (*pbVar29 = (*pbVar33 >> 6) * bVar17, uVar9 != 1)) &&
                         (pbVar29[1] = (*pbVar33 >> 4 & 3) * bVar17, uVar9 == 3)) {
                        pbVar29[2] = (*pbVar33 >> 2 & 3) * bVar17;
                      }
                    }
                    else if (depth == 1) {
                      uVar9 = uVar8;
                      if (7 < (int)uVar8) {
                        psVar32 = psVar5 + lVar15;
                        uVar31 = uVar8;
                        do {
                          psVar5[uVar26] = (char)psVar32[uVar26] >> 7 & bVar17;
                          psVar5[uVar26 + 1] = (char)(psVar32[uVar26] * '\x02') >> 7 & bVar17;
                          psVar5[uVar26 + 2] = (char)(psVar32[uVar26] << 2) >> 7 & bVar17;
                          psVar5[uVar26 + 3] = (char)(psVar32[uVar26] << 3) >> 7 & bVar17;
                          psVar5[uVar26 + 4] = (char)(psVar32[uVar26] << 4) >> 7 & bVar17;
                          psVar5[uVar26 + 5] = (char)(psVar32[uVar26] << 5) >> 7 & bVar17;
                          psVar5[uVar26 + 6] = (char)(psVar32[uVar26] << 6) >> 7 & bVar17;
                          bVar7 = bVar17;
                          if ((psVar32[uVar26] & 1) == 0) {
                            bVar7 = 0;
                          }
                          psVar5[uVar26 + 7] = bVar7;
                          uVar9 = uVar31 - 8;
                          psVar32 = psVar32 + 1;
                          psVar5 = psVar5 + 8;
                          bVar36 = 0xf < uVar31;
                          uVar31 = uVar9;
                        } while (bVar36);
                        pbVar33 = psVar32 + uVar26;
                        pbVar29 = psVar5 + uVar26;
                      }
                      if (((((0 < (int)uVar9) &&
                            (*pbVar29 = (char)*pbVar33 >> 7 & bVar17, uVar9 != 1)) &&
                           ((pbVar29[1] = (char)(*pbVar33 * '\x02') >> 7 & bVar17, 2 < uVar9 &&
                            ((pbVar29[2] = (char)(*pbVar33 << 2) >> 7 & bVar17, uVar9 != 3 &&
                             (pbVar29[3] = (char)(*pbVar33 << 3) >> 7 & bVar17, 4 < uVar9)))))) &&
                          (pbVar29[4] = (char)(*pbVar33 << 4) >> 7 & bVar17, uVar9 != 5)) &&
                         (pbVar29[5] = (char)(*pbVar33 << 5) >> 7 & bVar17, uVar9 == 7)) {
                        pbVar29[6] = (char)(*pbVar33 << 6) >> 7 & bVar17;
                      }
                    }
                    if (a_00 != out_n) {
                      psVar5 = a->out;
                      if (a_00 == 1) {
                        lVar22 = lVar10;
                        if (-1 < (int)uVar30) {
                          do {
                            psVar5[lVar22 * 2 + (uVar26 - 1)] = 0xff;
                            psVar5[lVar22 * 2 + (uVar26 - 2)] = psVar5[lVar22 + (uVar26 - 1)];
                            lVar23 = lVar22 + -1;
                            bVar36 = 0 < lVar22;
                            lVar22 = lVar23;
                          } while (lVar23 != 0 && bVar36);
                        }
                      }
                      else {
                        if (a_00 != 3) {
                          __assert_fail("img_n == 3",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/extern/stb/stb_image.h"
                                        ,0x1275,
                                        "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                                       );
                        }
                        if (-1 < (int)uVar30) {
                          psVar32 = psVar5 + (ulong)uVar30 * 3 + 2 + uVar26;
                          lVar22 = lVar10;
                          do {
                            psVar5[lVar22 * 4 + (uVar26 - 1)] = 0xff;
                            psVar5[lVar22 * 4 + (uVar26 - 2)] = *psVar32;
                            psVar5[lVar22 * 4 + (uVar26 - 3)] = psVar32[-1];
                            psVar5[lVar22 * 4 + (uVar26 - 4)] = psVar32[-2];
                            psVar32 = psVar32 + -3;
                            lVar23 = lVar22 + -1;
                            bVar36 = 0 < lVar22;
                            lVar22 = lVar23;
                          } while (lVar23 != 0 && bVar36);
                        }
                      }
                    }
                    uVar16 = uVar16 + 1;
                    uVar19 = uVar19 + uVar3;
                  } while (uVar16 != uVar6);
                  return 1;
                }
                goto joined_r0x001648d5;
              }
            }
            else {
              if (a_00 + 1 != out_n) {
                __assert_fail("img_n+1 == out_n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/extern/stb/stb_image.h"
                              ,0x121c,
                              "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                             );
              }
              switch(bVar17) {
              case 0:
                if (iVar4 != 0) {
                  iVar34 = iVar4;
                  do {
                    if (0 < (int)uVar30) {
                      uVar26 = 0;
                      do {
                        psVar32[uVar26] = raw[uVar26];
                        uVar26 = uVar26 + 1;
                      } while (uVar30 != uVar26);
                    }
                    psVar32[(int)uVar30] = 0xff;
                    raw = raw + (int)uVar30;
                    psVar32 = psVar32 + lVar22;
                    iVar34 = iVar34 + -1;
                  } while (iVar34 != 0);
                }
                break;
              case 1:
                if (iVar4 != 0) {
                  psVar5 = psVar5 + lVar25 + lVar23;
                  iVar34 = iVar4;
                  do {
                    if (0 < (int)uVar30) {
                      uVar26 = 0;
                      do {
                        psVar32[uVar26] = psVar5[uVar26] + raw[uVar26];
                        uVar26 = uVar26 + 1;
                      } while (uVar30 != uVar26);
                    }
                    psVar32[(int)uVar30] = 0xff;
                    raw = raw + (int)uVar30;
                    psVar32 = psVar32 + lVar22;
                    psVar5 = psVar5 + lVar22;
                    iVar34 = iVar34 + -1;
                  } while (iVar34 != 0);
                }
                break;
              case 2:
                if (iVar4 != 0) {
                  iVar34 = iVar4;
                  do {
                    if (0 < (int)uVar30) {
                      uVar26 = 0;
                      do {
                        psVar32[uVar26] = psVar32[uVar26 + lVar15] + raw[uVar26];
                        uVar26 = uVar26 + 1;
                      } while (uVar30 != uVar26);
                    }
                    psVar32[(int)uVar30] = 0xff;
                    raw = raw + (int)uVar30;
                    psVar32 = psVar32 + lVar22;
                    iVar34 = iVar34 + -1;
                  } while (iVar34 != 0);
                }
                break;
              case 3:
                if (iVar4 != 0) {
                  iVar34 = iVar4;
                  do {
                    if (0 < (int)uVar30) {
                      uVar26 = 0;
                      psVar5 = psVar32;
                      do {
                        *psVar5 = (char)((uint)psVar5[lVar23] + (uint)psVar5[lVar15] >> 1) +
                                  raw[uVar26];
                        uVar26 = uVar26 + 1;
                        psVar5 = psVar5 + 1;
                      } while (uVar30 != uVar26);
                    }
                    psVar32[(int)uVar30] = 0xff;
                    raw = raw + (int)uVar30;
                    psVar32 = psVar32 + lVar22;
                    iVar34 = iVar34 + -1;
                  } while (iVar34 != 0);
                }
                break;
              case 4:
                if (iVar4 != 0) {
                  psVar12 = psVar5 + lVar25 + lVar15;
                  psVar27 = psVar5 + lVar25 + lVar23;
                  psVar5 = psVar5 + lVar25 + (lVar23 - (ulong)uVar3);
                  iVar34 = iVar4;
                  do {
                    if (0 < (int)uVar30) {
                      uVar26 = 0;
                      do {
                        bVar17 = psVar27[uVar26];
                        bVar7 = psVar12[uVar26];
                        bVar21 = psVar5[uVar26];
                        iVar14 = ((uint)bVar7 + (uint)bVar17) - (uint)bVar21;
                        uVar31 = iVar14 - (uint)bVar17;
                        uVar9 = -uVar31;
                        if (0 < (int)uVar31) {
                          uVar9 = uVar31;
                        }
                        uVar28 = iVar14 - (uint)bVar7;
                        uVar31 = -uVar28;
                        if (0 < (int)uVar28) {
                          uVar31 = uVar28;
                        }
                        uVar13 = iVar14 - (uint)bVar21;
                        uVar28 = -uVar13;
                        if (0 < (int)uVar13) {
                          uVar28 = uVar13;
                        }
                        if (uVar31 <= uVar28) {
                          bVar21 = bVar7;
                        }
                        if (uVar28 < uVar9) {
                          bVar17 = bVar21;
                        }
                        if (uVar31 < uVar9) {
                          bVar17 = bVar21;
                        }
                        psVar32[uVar26] = bVar17 + raw[uVar26];
                        uVar26 = uVar26 + 1;
                      } while (uVar30 != uVar26);
                    }
                    psVar32[(int)uVar30] = 0xff;
                    raw = raw + (int)uVar30;
                    psVar32 = psVar32 + lVar22;
                    psVar12 = psVar12 + lVar22;
                    psVar27 = psVar27 + lVar22;
                    psVar5 = psVar5 + lVar22;
                    iVar34 = iVar34 + -1;
                  } while (iVar34 != 0);
                }
                break;
              case 5:
                if (iVar4 != 0) {
                  psVar5 = psVar5 + lVar25 + lVar23;
                  iVar34 = iVar4;
                  do {
                    if (0 < (int)uVar30) {
                      uVar26 = 0;
                      do {
                        psVar32[uVar26] = (psVar5[uVar26] >> 1) + raw[uVar26];
                        uVar26 = uVar26 + 1;
                      } while (uVar30 != uVar26);
                    }
                    psVar32[(int)uVar30] = 0xff;
                    raw = raw + (int)uVar30;
                    psVar32 = psVar32 + lVar22;
                    psVar5 = psVar5 + lVar22;
                    iVar34 = iVar34 + -1;
                  } while (iVar34 != 0);
                }
                break;
              case 6:
                if (iVar4 != 0) {
                  psVar5 = psVar5 + lVar25 + lVar23;
                  iVar34 = iVar4;
                  do {
                    if (0 < (int)uVar30) {
                      uVar26 = 0;
                      do {
                        psVar32[uVar26] = psVar5[uVar26] + raw[uVar26];
                        uVar26 = uVar26 + 1;
                      } while (uVar30 != uVar26);
                    }
                    psVar32[(int)uVar30] = 0xff;
                    raw = raw + (int)uVar30;
                    psVar32 = psVar32 + lVar22;
                    psVar5 = psVar5 + lVar22;
                    iVar34 = iVar34 + -1;
                  } while (iVar34 != 0);
                }
              }
              if (depth != 0x10) goto LAB_00164fc8;
              if (x != 0) {
                psVar5 = a->out + (long)(int)uVar30 + uVar16 + 1;
                uVar16 = (ulong)x;
                do {
                  *psVar5 = 0xff;
                  psVar5 = psVar5 + lVar22;
                  uVar9 = (int)uVar16 - 1;
                  uVar16 = (ulong)uVar9;
                } while (uVar9 != 0);
                goto LAB_00164fc8;
              }
              if (lVar24 + 1U == uVar6) goto LAB_001648d7;
            }
            lVar24 = lVar24 + 1;
            uVar16 = (ulong)(uVar3 * (int)lVar24);
            psVar5 = a->out + uVar16;
            bVar17 = *raw;
          } while (bVar17 < 5);
        }
        pcVar18 = "Corrupt PNG";
      }
    }
  }
  *(char **)(in_FS_OFFSET + -0x10) = pcVar18;
  return 0;
}

Assistant:

static int stbi__create_png_image_raw(stbi__png *a, stbi_uc *raw, stbi__uint32 raw_len, int out_n, stbi__uint32 x, stbi__uint32 y, int depth, int color)
{
   int bytes = (depth == 16? 2 : 1);
   stbi__context *s = a->s;
   stbi__uint32 i,j,stride = x*out_n*bytes;
   stbi__uint32 img_len, img_width_bytes;
   int k;
   int img_n = s->img_n; // copy it into a local for later

   int output_bytes = out_n*bytes;
   int filter_bytes = img_n*bytes;
   int width = x;

   STBI_ASSERT(out_n == s->img_n || out_n == s->img_n+1);
   a->out = (stbi_uc *) stbi__malloc_mad3(x, y, output_bytes, 0); // extra bytes to write off the end into
   if (!a->out) return stbi__err("outofmem", "Out of memory");

   if (!stbi__mad3sizes_valid(img_n, x, depth, 7)) return stbi__err("too large", "Corrupt PNG");
   img_width_bytes = (((img_n * x * depth) + 7) >> 3);
   img_len = (img_width_bytes + 1) * y;

   // we used to check for exact match between raw_len and img_len on non-interlaced PNGs,
   // but issue #276 reported a PNG in the wild that had extra data at the end (all zeros),
   // so just check for raw_len < img_len always.
   if (raw_len < img_len) return stbi__err("not enough pixels","Corrupt PNG");

   for (j=0; j < y; ++j) {
      stbi_uc *cur = a->out + stride*j;
      stbi_uc *prior;
      int filter = *raw++;

      if (filter > 4)
         return stbi__err("invalid filter","Corrupt PNG");

      if (depth < 8) {
         if (img_width_bytes > x) return stbi__err("invalid width","Corrupt PNG");
         cur += x*out_n - img_width_bytes; // store output to the rightmost img_len bytes, so we can decode in place
         filter_bytes = 1;
         width = img_width_bytes;
      }
      prior = cur - stride; // bugfix: need to compute this after 'cur +=' computation above

      // if first row, use special filter that doesn't sample previous row
      if (j == 0) filter = first_row_filter[filter];

      // handle first byte explicitly
      for (k=0; k < filter_bytes; ++k) {
         switch (filter) {
            case STBI__F_none       : cur[k] = raw[k]; break;
            case STBI__F_sub        : cur[k] = raw[k]; break;
            case STBI__F_up         : cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            case STBI__F_avg        : cur[k] = STBI__BYTECAST(raw[k] + (prior[k]>>1)); break;
            case STBI__F_paeth      : cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(0,prior[k],0)); break;
            case STBI__F_avg_first  : cur[k] = raw[k]; break;
            case STBI__F_paeth_first: cur[k] = raw[k]; break;
         }
      }

      if (depth == 8) {
         if (img_n != out_n)
            cur[img_n] = 255; // first pixel
         raw += img_n;
         cur += out_n;
         prior += out_n;
      } else if (depth == 16) {
         if (img_n != out_n) {
            cur[filter_bytes]   = 255; // first pixel top byte
            cur[filter_bytes+1] = 255; // first pixel bottom byte
         }
         raw += filter_bytes;
         cur += output_bytes;
         prior += output_bytes;
      } else {
         raw += 1;
         cur += 1;
         prior += 1;
      }

      // this is a little gross, so that we don't switch per-pixel or per-component
      if (depth < 8 || img_n == out_n) {
         int nk = (width - 1)*filter_bytes;
         #define STBI__CASE(f) \
             case f:     \
                for (k=0; k < nk; ++k)
         switch (filter) {
            // "none" filter turns into a memcpy here; make that explicit.
            case STBI__F_none:         memcpy(cur, raw, nk); break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k-filter_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k-filter_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],prior[k],prior[k-filter_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k-filter_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],0,0)); } break;
         }
         #undef STBI__CASE
         raw += nk;
      } else {
         STBI_ASSERT(img_n+1 == out_n);
         #define STBI__CASE(f) \
             case f:     \
                for (i=x-1; i >= 1; --i, cur[filter_bytes]=255,raw+=filter_bytes,cur+=output_bytes,prior+=output_bytes) \
                   for (k=0; k < filter_bytes; ++k)
         switch (filter) {
            STBI__CASE(STBI__F_none)         { cur[k] = raw[k]; } break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k- output_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k- output_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],prior[k],prior[k- output_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k- output_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],0,0)); } break;
         }
         #undef STBI__CASE

         // the loop above sets the high byte of the pixels' alpha, but for
         // 16 bit png files we also need the low byte set. we'll do that here.
         if (depth == 16) {
            cur = a->out + stride*j; // start at the beginning of the row again
            for (i=0; i < x; ++i,cur+=output_bytes) {
               cur[filter_bytes+1] = 255;
            }
         }
      }